

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

int __thiscall QGuiApplicationPrivate::init(QGuiApplicationPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  QGuiApplication *app;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  qsizetype qVar15;
  QOpenGLContext *pQVar16;
  QObject *t;
  QSessionManager *this_00;
  code *pcVar17;
  QDebug *this_01;
  uint uVar18;
  int iVar19;
  char *pcVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  char *__s1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  Data *local_1c0;
  char16_t *local_1b8;
  qsizetype local_1b0;
  Object local_1a0 [8];
  QArrayDataPointer<char> local_198;
  QByteArrayView local_178;
  QByteArrayView local_168;
  QByteArrayView local_158;
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<QByteArray> local_e8;
  QArrayDataPointer<QByteArray> local_c8;
  char *local_b0;
  QArrayDataPointer<char> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplicationPrivate::init();
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (QByteArray *)0x0;
  local_e8.size = 0;
  local_108.size._0_4_ = 0;
  local_108.size._4_4_ = 0;
  local_108.d._0_4_ = 0;
  local_108.d._4_4_ = 0;
  local_108.ptr._0_4_ = 0;
  local_108.ptr._4_4_ = 0;
  local_128.size = 0;
  local_148.size = 0;
  local_128.d = (Data *)0x0;
  local_128.ptr = (char16_t *)0x0;
  local_148.d = (Data *)0x0;
  local_148.ptr = (char16_t *)0x0;
  iVar14 = **(int **)&this->field_0x80;
  uVar18 = (uint)(iVar14 != 0);
  iVar19 = 1;
  local_1b0 = 0;
  local_1b8 = (char16_t *)0x0;
  local_1c0 = (Data *)0x0;
  bVar11 = false;
  do {
    lVar21 = (long)(int)uVar18;
    if (iVar14 <= iVar19) {
      if ((int)uVar18 < iVar14) {
        *(undefined8 *)(*(long *)&this->field_0x88 + lVar21 * 8) = 0;
        **(uint **)&this->field_0x80 = uVar18;
      }
      local_198.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_198.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_198.ptr = &DAT_aaaaaaaaaaaaaaaa;
      qgetenv((char *)&local_198);
      if ((undefined1 *)local_198.size != (undefined1 *)0x0) {
        QByteArray::split((char)&local_c8);
        QList<QByteArray>::append((QList<QByteArray> *)&local_e8,(QList<QByteArray> *)&local_c8);
        QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_c8);
      }
      if (platform_integration == (QPlatformIntegration *)0x0) {
        createPlatformIntegration(this);
      }
      updatePalette();
      QFont::initialize();
      initThemeHints();
      QCursorData::initialize();
      qRegisterGuiVariant();
      qRegisterGuiGetInterpolator();
      cVar12 = QCoreApplication::testAttribute(AA_ShareOpenGLContexts);
      if ((cVar12 != '\0') &&
         (pQVar16 = qt_gl_global_share_context(), pQVar16 == (QOpenGLContext *)0x0)) {
        pQVar16 = (QOpenGLContext *)operator_new(0x10);
        QOpenGLContext::QOpenGLContext(pQVar16,(QObject *)0x0);
        QSurfaceFormat::defaultFormat();
        QOpenGLContext::setFormat(pQVar16,(QSurfaceFormat *)&local_c8);
        QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_c8);
        QOpenGLContext::create(pQVar16);
        qt_gl_set_global_share_context(pQVar16);
        this->ownGlobalShareContext = true;
      }
      QElapsedTimer::start();
      QCoreApplicationPrivate::is_app_running._0_1_ = 1;
      lVar21 = 0x10;
      for (uVar22 = 0; uVar22 < (ulong)local_e8.size; uVar22 = uVar22 + 1) {
        local_58.d = *(Data **)((long)local_e8.ptr + lVar21 + -0x10);
        local_58.ptr = *(char **)((long)local_e8.ptr + lVar21 + -8);
        local_58.size = *(undefined8 *)((long)&((local_e8.ptr)->d).d + lVar21);
        if (local_58.d != (Data *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        qVar15 = QByteArray::indexOf((QByteArray *)&local_58,':',0);
        if (qVar15 < 0) {
          latin1_01.m_data = local_58.ptr;
          latin1_01.m_size = local_58.size;
          QString::QString((QString *)&local_c8,latin1_01);
          local_78.d = (Data *)0x0;
          local_78.ptr = (char16_t *)0x0;
          local_78.size = 0;
          t = QGenericPluginFactory::create((QString *)&local_c8,(QString *)&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
        }
        else {
          QByteArray::mid((longlong)&local_78,(longlong)&local_58);
          latin1.m_data = (char *)local_78.ptr;
          latin1.m_size = local_78.size;
          QString::QString((QString *)&local_c8,latin1);
          QByteArray::mid((longlong)&local_a8,(longlong)&local_58);
          latin1_00.m_data = local_a8.ptr;
          latin1_00.m_size = local_a8.size;
          QString::QString((QString *)&local_90,latin1_00);
          t = QGenericPluginFactory::create((QString *)&local_c8,(QString *)&local_90);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
        }
        if (t == (parameter_type)0x0) {
          local_c8.d._0_4_ = 2;
          local_c8.size._4_4_ = 0;
          local_c8.d._4_4_ = 0;
          local_c8.ptr._0_4_ = 0;
          local_c8.ptr._4_4_ = 0;
          local_c8.size._0_4_ = 0;
          local_b0 = "default";
          pcVar20 = local_58.ptr;
          if (local_58.ptr == (char *)0x0) {
            pcVar20 = (char *)&QByteArray::_empty;
          }
          QMessageLogger::warning((char *)&local_c8,"No such plugin for spec \"%s\"",pcVar20);
        }
        else {
          QList<QObject_*>::append(&generic_plugin_list,t);
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        lVar21 = lVar21 + 0x18;
      }
      QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      app = *(QGuiApplication **)&this->field_0x8;
      this_00 = (QSessionManager *)operator_new(0x10);
      QSessionManager::QSessionManager(this_00,app,(QString *)&local_108,(QString *)&local_128);
      this->session_manager = this_00;
      iVar14 = qEnvironmentVariableIntValue("QT_LOAD_TESTABILITY",(bool *)0x0);
      if (0 < iVar14 || bVar11) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_c8.d._0_4_ = 0;
        local_c8.d._4_4_ = 0;
        local_78.d = (Data *)0x0;
        local_78.ptr = (char16_t *)0x0;
        local_c8.ptr._0_4_ = 0x5d0cfc;
        local_c8.ptr._4_4_ = 0;
        local_78.size = 0;
        local_c8.size._0_4_ = 0xd;
        local_c8.size._4_4_ = 0;
        QLibrary::QLibrary((QLibrary *)&local_58,(QString *)&local_c8,(QObject *)0x0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        cVar12 = QLibrary::load();
        if (cVar12 == '\0') {
          local_c8.d._0_4_ = 2;
          local_c8.d._4_4_ = 0;
          local_c8.ptr._0_4_ = 0;
          local_c8.ptr._4_4_ = 0;
          local_c8.size._0_4_ = 0;
          local_c8.size._4_4_ = 0;
          local_b0 = "default";
          QMessageLogger::critical();
          this_01 = QDebug::operator<<((QDebug *)&local_90,"Library qttestability load failed:");
          QLibrary::errorString();
          QDebug::operator<<(this_01,(QString *)&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QDebug::~QDebug((QDebug *)&local_90);
        }
        else {
          pcVar17 = (code *)QLibrary::resolve((char *)&local_58);
          if (pcVar17 == (code *)0x0) {
            local_c8.d._0_4_ = 2;
            local_c8.d._4_4_ = 0;
            local_c8.ptr._0_4_ = 0;
            local_c8.ptr._4_4_ = 0;
            local_c8.size._0_4_ = 0;
            local_c8.size._4_4_ = 0;
            local_b0 = "default";
            QMessageLogger::critical((char *)&local_c8,"Library qttestability resolve failed!");
          }
          else {
            (*pcVar17)();
          }
        }
        QLibrary::~QLibrary((QLibrary *)&local_58);
      }
      QGuiApplication::setLayoutDirection(layout_direction);
      if (displayName == (QString *)0x0) {
        local_c8.d._0_4_ = 0x2a7408;
        local_c8.d._4_4_ = 0;
        local_c8.ptr._0_4_ = 0;
        local_c8.ptr._4_4_ = 0;
        QObject::connect<void(QCoreApplication::*)(),void(QGuiApplication::*)()>
                  (local_1a0,(offset_in_QCoreApplication_to_subr)app,
                   (ContextType *)QCoreApplication::applicationNameChanged,
                   (offset_in_QGuiApplication_to_subr *)0x0,(ConnectionType)app);
        QMetaObject::Connection::~Connection((Connection *)local_1a0);
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_198);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_e8);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
    lVar1 = *(long *)&this->field_0x88;
    lVar23 = (long)iVar19;
    pcVar20 = *(char **)(lVar1 + lVar23 * 8);
    if (pcVar20 != (char *)0x0) {
      if (*pcVar20 == '-') {
        __s1 = pcVar20 + 1;
        if (pcVar20[1] != '-') {
          __s1 = pcVar20;
        }
        iVar13 = strcmp(__s1,"-plugin");
        if (iVar13 == 0) {
          if (iVar19 + 1 < iVar14) {
            QByteArray::QByteArray
                      ((QByteArray *)&local_c8,*(char **)(lVar1 + (long)(iVar19 + 1) * 8),-1);
            QList<QByteArray>::emplaceBack<QByteArray>
                      ((QList<QByteArray> *)&local_e8,(QByteArray *)&local_c8);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
          }
LAB_002a6699:
          iVar19 = iVar19 + 1;
        }
        else {
          iVar13 = strcmp(__s1,"-reverse");
          if (iVar13 == 0) {
            force_reverse = 1;
          }
          else {
            iVar13 = strcmp(__s1,"-session");
            if ((iVar13 == 0) && (iVar19 < iVar14 + -1)) {
              iVar19 = iVar19 + 1;
              pcVar20 = *(char **)(lVar1 + 8 + lVar23 * 8);
              if ((pcVar20 != (char *)0x0) && (*pcVar20 != '\0')) {
                QByteArrayView::QByteArrayView<char_*,_true>
                          (&local_158,(char **)(lVar23 * 8 + 8 + lVar1));
                QVar24.m_data = (storage_type *)local_158.m_size;
                QVar24.m_size = (qsizetype)&local_c8;
                QString::fromLatin1(QVar24);
                uVar5 = local_c8.d._0_4_;
                uVar6 = local_c8.d._4_4_;
                uVar7 = local_c8.ptr._0_4_;
                uVar8 = local_c8.ptr._4_4_;
                local_c8.d._0_4_ = local_108.d._0_4_;
                local_c8.d._4_4_ = local_108.d._4_4_;
                local_c8.ptr._0_4_ = local_108.ptr._0_4_;
                local_c8.ptr._4_4_ = local_108.ptr._4_4_;
                uVar9 = (undefined4)local_c8.size;
                uVar10 = local_c8.size._4_4_;
                local_c8.size._0_4_ = (undefined4)local_108.size;
                local_c8.size._4_4_ = local_108.size._4_4_;
                local_108.d._0_4_ = uVar5;
                local_108.d._4_4_ = uVar6;
                local_108.ptr._0_4_ = uVar7;
                local_108.ptr._4_4_ = uVar8;
                local_108.size._0_4_ = uVar9;
                local_108.size._4_4_ = uVar10;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_c8);
                qVar15 = QString::indexOf((QString *)&local_108,(QChar)0x5f,0,CaseSensitive);
                if (-1 < qVar15) {
                  QString::mid((longlong)&local_c8,(longlong)&local_108);
                  pDVar2 = (Data *)CONCAT44(local_c8.d._4_4_,local_c8.d._0_4_);
                  pcVar3 = (char16_t *)CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
                  local_c8.d._0_4_ = SUB84(local_1c0,0);
                  local_c8.d._4_4_ = (undefined4)((ulong)local_1c0 >> 0x20);
                  local_c8.ptr._0_4_ = SUB84(local_1b8,0);
                  local_c8.ptr._4_4_ = (undefined4)((ulong)local_1b8 >> 0x20);
                  qVar4 = CONCAT44(local_c8.size._4_4_,(undefined4)local_c8.size);
                  local_c8.size._0_4_ = (undefined4)local_1b0;
                  local_c8.size._4_4_ = (undefined4)((ulong)local_1b0 >> 0x20);
                  local_128.d = pDVar2;
                  local_128.ptr = pcVar3;
                  local_128.size = qVar4;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QString::left((QString *)&local_c8,(QString *)&local_108,qVar15);
                  uVar5 = local_c8.d._0_4_;
                  uVar6 = local_c8.d._4_4_;
                  uVar7 = local_c8.ptr._0_4_;
                  uVar8 = local_c8.ptr._4_4_;
                  local_c8.d._0_4_ = local_108.d._0_4_;
                  local_c8.d._4_4_ = local_108.d._4_4_;
                  local_c8.ptr._0_4_ = local_108.ptr._0_4_;
                  local_c8.ptr._4_4_ = local_108.ptr._4_4_;
                  uVar9 = (undefined4)local_c8.size;
                  uVar10 = local_c8.size._4_4_;
                  local_c8.size._0_4_ = (undefined4)local_108.size;
                  local_c8.size._4_4_ = local_108.size._4_4_;
                  local_108.d._0_4_ = uVar5;
                  local_108.d._4_4_ = uVar6;
                  local_108.ptr._0_4_ = uVar7;
                  local_108.ptr._4_4_ = uVar8;
                  local_108.size._0_4_ = uVar9;
                  local_108.size._4_4_ = uVar10;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  local_1c0 = pDVar2;
                  local_1b8 = pcVar3;
                  local_1b0 = qVar4;
                }
                this->is_session_restored = true;
              }
            }
            else {
              iVar13 = strcmp(__s1,"-testability");
              if (iVar13 == 0) {
                bVar11 = true;
              }
              else {
                iVar13 = strncmp(__s1,"-style=",7);
                if (iVar13 == 0) {
                  local_58.d = (Data *)(__s1 + 7);
                  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_168,(char **)&local_58);
                  QVar26.m_data = (storage_type *)local_168.m_size;
                  QVar26.m_size = (qsizetype)&local_c8;
                  QString::fromLocal8Bit(QVar26);
                  pDVar2 = (Data *)CONCAT44(local_c8.d._4_4_,local_c8.d._0_4_);
                  pcVar3 = (char16_t *)CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
                  local_c8.d._0_4_ = SUB84(local_148.d,0);
                  local_c8.d._4_4_ = (undefined4)((ulong)local_148.d >> 0x20);
                  local_c8.ptr._0_4_ = SUB84(local_148.ptr,0);
                  local_c8.ptr._4_4_ = (undefined4)((ulong)local_148.ptr >> 0x20);
                  lVar21 = CONCAT44(local_c8.size._4_4_,(undefined4)local_c8.size);
                  local_c8.size._0_4_ = (undefined4)local_148.size;
                  local_c8.size._4_4_ = (undefined4)((ulong)local_148.size >> 0x20);
                  local_148.d = pDVar2;
                  local_148.ptr = pcVar3;
                  local_148.size = lVar21;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                }
                else {
                  iVar13 = strcmp(__s1,"-style");
                  if ((iVar13 == 0) && (iVar19 < iVar14 + -1)) {
                    QByteArrayView::QByteArrayView<char_*,_true>
                              (&local_178,(char **)(lVar23 * 8 + 8 + lVar1));
                    QVar25.m_data = (storage_type *)local_178.m_size;
                    QVar25.m_size = (qsizetype)&local_c8;
                    QString::fromLocal8Bit(QVar25);
                    pDVar2 = (Data *)CONCAT44(local_c8.d._4_4_,local_c8.d._0_4_);
                    pcVar3 = (char16_t *)CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
                    local_c8.d._0_4_ = SUB84(local_148.d,0);
                    local_c8.d._4_4_ = (undefined4)((ulong)local_148.d >> 0x20);
                    local_c8.ptr._0_4_ = SUB84(local_148.ptr,0);
                    local_c8.ptr._4_4_ = (undefined4)((ulong)local_148.ptr >> 0x20);
                    lVar21 = CONCAT44(local_c8.size._4_4_,(undefined4)local_c8.size);
                    local_c8.size._0_4_ = (undefined4)local_148.size;
                    local_c8.size._4_4_ = (undefined4)((ulong)local_148.size >> 0x20);
                    local_148.d = pDVar2;
                    local_148.ptr = pcVar3;
                    local_148.size = lVar21;
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_c8);
                    goto LAB_002a6699;
                  }
                  uVar18 = uVar18 + 1;
                  *(char **)(lVar1 + lVar21 * 8) = pcVar20;
                }
              }
            }
          }
        }
        if (local_148.size != 0) {
          QString::operator=(&styleOverride,(QString *)&local_148);
        }
      }
      else {
        uVar18 = uVar18 + 1;
        *(char **)(lVar1 + lVar21 * 8) = pcVar20;
      }
    }
    iVar19 = iVar19 + 1;
    iVar14 = **(int **)&this->field_0x80;
  } while( true );
}

Assistant:

QGuiApplicationPrivate::init()
{
    Q_TRACE_SCOPE(QGuiApplicationPrivate_init);

#if defined(Q_OS_MACOS)
    QMacAutoReleasePool pool;
#endif

    QCoreApplicationPrivate::init();

    QCoreApplicationPrivate::is_app_running = false; // Starting up.

    bool loadTestability = false;
    QList<QByteArray> pluginList;
    // Get command line params
#ifndef QT_NO_SESSIONMANAGER
    QString session_id;
    QString session_key;
# if defined(Q_OS_WIN)
    wchar_t guidstr[40];
    GUID guid;
    CoCreateGuid(&guid);
    StringFromGUID2(guid, guidstr, 40);
    session_id = QString::fromWCharArray(guidstr);
    CoCreateGuid(&guid);
    StringFromGUID2(guid, guidstr, 40);
    session_key = QString::fromWCharArray(guidstr);
# endif
#endif
    QString s;
    int j = argc ? 1 : 0;
    for (int i=1; i<argc; i++) {
        if (!argv[i])
            continue;
        if (*argv[i] != '-') {
            argv[j++] = argv[i];
            continue;
        }
        const char *arg = argv[i];
        if (arg[1] == '-') // startsWith("--")
            ++arg;
        if (strcmp(arg, "-plugin") == 0) {
            if (++i < argc)
                pluginList << argv[i];
        } else if (strcmp(arg, "-reverse") == 0) {
            force_reverse = true;
#ifdef Q_OS_MAC
        } else if (strncmp(arg, "-psn_", 5) == 0) {
            // eat "-psn_xxxx" on Mac, which is passed when starting an app from Finder.
            // special hack to change working directory (for an app bundle) when running from finder
            if (QDir::currentPath() == "/"_L1) {
                QCFType<CFURLRef> bundleURL(CFBundleCopyBundleURL(CFBundleGetMainBundle()));
                QString qbundlePath = QCFString(CFURLCopyFileSystemPath(bundleURL,
                                                                        kCFURLPOSIXPathStyle));
                if (qbundlePath.endsWith(".app"_L1))
                    QDir::setCurrent(qbundlePath.section(u'/', 0, -2));
            }
#endif
#ifndef QT_NO_SESSIONMANAGER
        } else if (strcmp(arg, "-session") == 0 && i < argc - 1) {
            ++i;
            if (argv[i] && *argv[i]) {
                session_id = QString::fromLatin1(argv[i]);
                qsizetype p = session_id.indexOf(u'_');
                if (p >= 0) {
                    session_key = session_id.mid(p +1);
                    session_id = session_id.left(p);
                }
                is_session_restored = true;
            }
#endif
        } else if (strcmp(arg, "-testability") == 0) {
            loadTestability = true;
        } else if (strncmp(arg, "-style=", 7) == 0) {
            s = QString::fromLocal8Bit(arg + 7);
        } else if (strcmp(arg, "-style") == 0 && i < argc - 1) {
            s = QString::fromLocal8Bit(argv[++i]);
        } else {
            argv[j++] = argv[i];
        }

        if (!s.isEmpty())
            styleOverride = s;
    }

    if (j < argc) {
        argv[j] = nullptr;
        argc = j;
    }

    // Load environment exported generic plugins
    QByteArray envPlugins = qgetenv("QT_QPA_GENERIC_PLUGINS");
    if (!envPlugins.isEmpty())
        pluginList += envPlugins.split(',');

    if (platform_integration == nullptr)
        createPlatformIntegration();

    updatePalette();
    QFont::initialize();
    initThemeHints();

#ifndef QT_NO_CURSOR
    QCursorData::initialize();
#endif

    // trigger registering of QVariant's GUI types
    qRegisterGuiVariant();

#if QT_CONFIG(animation)
    // trigger registering of animation interpolators
    qRegisterGuiGetInterpolator();
#endif

    // set a global share context when enabled unless there is already one
#ifndef QT_NO_OPENGL
    if (qApp->testAttribute(Qt::AA_ShareOpenGLContexts) && !qt_gl_global_share_context()) {
        QOpenGLContext *ctx = new QOpenGLContext;
        ctx->setFormat(QSurfaceFormat::defaultFormat());
        ctx->create();
        qt_gl_set_global_share_context(ctx);
        ownGlobalShareContext = true;
    }
#endif

    QWindowSystemInterfacePrivate::eventTime.start();

    is_app_running = true;
    init_plugins(pluginList);
    QWindowSystemInterface::flushWindowSystemEvents();

    Q_Q(QGuiApplication);
#ifndef QT_NO_SESSIONMANAGER
    // connect to the session manager
    session_manager = new QSessionManager(q, session_id, session_key);
#endif

#if QT_CONFIG(library)
    if (qEnvironmentVariableIntValue("QT_LOAD_TESTABILITY") > 0)
        loadTestability = true;

    if (loadTestability) {
        QLibrary testLib(QStringLiteral("qttestability"));
        if (Q_UNLIKELY(!testLib.load())) {
            qCritical() << "Library qttestability load failed:" << testLib.errorString();
        } else {
            typedef void (*TasInitialize)(void);
            TasInitialize initFunction = (TasInitialize)testLib.resolve("qt_testability_init");
            if (Q_UNLIKELY(!initFunction)) {
                qCritical("Library qttestability resolve failed!");
            } else {
                initFunction();
            }
        }
    }
#else
    Q_UNUSED(loadTestability);
#endif // QT_CONFIG(library)

    // trigger changed signal and event delivery
    QGuiApplication::setLayoutDirection(layout_direction);

    if (!QGuiApplicationPrivate::displayName)
        QObject::connect(q, &QGuiApplication::applicationNameChanged,
                         q, &QGuiApplication::applicationDisplayNameChanged);
}